

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

void __thiscall
QPDF::reserveObjects(QPDF *this,QPDFObjectHandle *foreign,ObjCopier *obj_copier,bool top)

{
  bool bVar1;
  qpdf_object_type_e qVar2;
  size_type sVar3;
  mapped_type *this_00;
  QPDFObjGen og;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *this_01;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  logic_error *this_02;
  QPDFObjGen foreign_og;
  Array local_80;
  BaseHandle *local_68;
  QPDFObjectHandle local_60;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  qVar2 = QPDFObjectHandle::getTypeCode(foreign);
  if (qVar2 == ot_reserved) {
    this_02 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_02,"QPDF: attempting to copy a foreign reserved object");
    __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  bVar1 = QPDFObjectHandle::isPagesObject(foreign);
  if (bVar1) {
    return;
  }
  bVar1 = QPDFObjectHandle::isIndirect(foreign);
  if (bVar1) {
    foreign_og = QPDFObjectHandle::getObjGen(foreign);
    bVar1 = QPDFObjGen::set::add(&obj_copier->visiting,foreign_og);
    if (!bVar1) {
      return;
    }
    sVar3 = std::
            map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
            ::count(&obj_copier->object_map,&foreign_og);
    if (sVar3 != 0) {
      if ((top) && (bVar1 = QPDFObjectHandle::isPageObject(foreign), bVar1)) {
        this_00 = std::
                  map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                  ::operator[](&obj_copier->object_map,&foreign_og);
        bVar1 = QPDFObjectHandle::isNull(this_00);
        if (bVar1) goto LAB_00131db3;
      }
      og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&foreign->super_BaseHandle);
      goto LAB_00131f15;
    }
    bVar1 = QPDFObjectHandle::isStream(foreign);
    if (bVar1) {
      newStream((QPDF *)&local_80);
    }
    else {
      newIndirectNull((QPDF *)&local_80);
    }
    this_01 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
              std::
              map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
              ::operator[](&obj_copier->object_map,&foreign_og);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_01,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_80.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if ((!top) && (bVar1 = QPDFObjectHandle::isPageObject(foreign), og = foreign_og, bVar1))
    goto LAB_00131f15;
LAB_00131db3:
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
              (&obj_copier->to_copy,foreign);
  }
  if (qVar2 == ot_stream) {
    QPDFObjectHandle::getDict(&local_60);
    reserveObjects(this,&local_60,obj_copier,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_60.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else if (qVar2 == ot_dictionary) {
    local_68 = &foreign->super_BaseHandle;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_80,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)foreign);
    iVar6 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&local_80);
    iVar7 = ::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&local_80);
    for (; iVar6._M_node != iVar7._M_node;
        iVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar6._M_node)) {
      bVar1 = ::qpdf::BaseHandle::null((BaseHandle *)(iVar6._M_node + 2));
      if (!bVar1) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_50,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(iVar6._M_node + 2));
        reserveObjects(this,(QPDFObjectHandle *)&local_50,obj_copier,false);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_80.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    foreign = (QPDFObjectHandle *)local_68;
  }
  else if (qVar2 == ot_array) {
    local_68 = &foreign->super_BaseHandle;
    ::qpdf::Array::Array(&local_80,(shared_ptr<QPDFObject> *)foreign);
    iVar4 = ::qpdf::Array::begin(&local_80);
    iVar5 = ::qpdf::Array::end(&local_80);
    for (; iVar4._M_current != iVar5._M_current;
        iVar4._M_current =
             (QPDFObjectHandle *)
             ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)iVar4._M_current + 1)) {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)iVar4._M_current)
      ;
      reserveObjects(this,(QPDFObjectHandle *)&local_40,obj_copier,false);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
    ::qpdf::Array::~Array(&local_80);
    foreign = (QPDFObjectHandle *)local_68;
  }
  og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&foreign->super_BaseHandle);
LAB_00131f15:
  QPDFObjGen::set::erase(&obj_copier->visiting,og);
  return;
}

Assistant:

void
QPDF::reserveObjects(QPDFObjectHandle foreign, ObjCopier& obj_copier, bool top)
{
    auto foreign_tc = foreign.getTypeCode();
    if (foreign_tc == ::ot_reserved) {
        throw std::logic_error("QPDF: attempting to copy a foreign reserved object");
    }

    if (foreign.isPagesObject()) {
        QTC::TC("qpdf", "QPDF not copying pages object");
        return;
    }

    if (foreign.isIndirect()) {
        QPDFObjGen foreign_og(foreign.getObjGen());
        if (!obj_copier.visiting.add(foreign_og)) {
            QTC::TC("qpdf", "QPDF loop reserving objects");
            return;
        }
        if (obj_copier.object_map.count(foreign_og) > 0) {
            QTC::TC("qpdf", "QPDF already reserved object");
            if (!(top && foreign.isPageObject() && obj_copier.object_map[foreign_og].isNull())) {
                obj_copier.visiting.erase(foreign);
                return;
            }
        } else {
            QTC::TC("qpdf", "QPDF copy indirect");
            obj_copier.object_map[foreign_og] =
                foreign.isStream() ? newStream() : newIndirectNull();
            if ((!top) && foreign.isPageObject()) {
                QTC::TC("qpdf", "QPDF not crossing page boundary");
                obj_copier.visiting.erase(foreign_og);
                return;
            }
        }
        obj_copier.to_copy.push_back(foreign);
    }

    if (foreign_tc == ::ot_array) {
        QTC::TC("qpdf", "QPDF reserve array");
        for (auto const& item: foreign.as_array()) {
            reserveObjects(item, obj_copier, false);
        }
    } else if (foreign_tc == ::ot_dictionary) {
        QTC::TC("qpdf", "QPDF reserve dictionary");
        for (auto const& item: foreign.as_dictionary()) {
            if (!item.second.null()) {
                reserveObjects(item.second, obj_copier, false);
            }
        }
    } else if (foreign_tc == ::ot_stream) {
        QTC::TC("qpdf", "QPDF reserve stream");
        reserveObjects(foreign.getDict(), obj_copier, false);
    }

    obj_copier.visiting.erase(foreign);
}